

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgrayraster.c
# Opt level: O3

int gray_raster_render(QT_FT_Raster raster,QT_FT_Raster_Params *params)

{
  QT_FT_BBox *pQVar1;
  uint uVar2;
  int iVar3;
  QT_FT_Bitmap *pQVar4;
  int *piVar5;
  PWorker worker;
  QT_FT_Vector *pQVar6;
  char *pcVar7;
  int *piVar8;
  QT_FT_Pos QVar9;
  QT_FT_Pos QVar10;
  QT_FT_Pos QVar11;
  short sVar12;
  char cVar13;
  char cVar14;
  undefined4 uVar15;
  int iVar16;
  undefined4 uVar17;
  int iVar18;
  PCell_conflict *ppTVar19;
  long lVar20;
  
  if (((raster == (QT_FT_Raster)0x0) ||
      (ppTVar19 = (PCell_conflict *)raster->buffer, ppTVar19 == (PCell_conflict *)0x0)) ||
     (lVar20 = raster->buffer_size, lVar20 == 0)) {
LAB_003902b0:
    iVar18 = -3;
  }
  else {
    pQVar4 = params->target;
    piVar5 = (int *)params->source;
    worker = raster->worker;
    worker->skip_spans = params->skip_spans;
    if (raster->buffer_allocated_size < 0x2000) {
      return -6;
    }
    if (piVar5 == (int *)0x0) {
      return -1;
    }
    if ((piVar5[1] != 0) && (0 < (long)*piVar5)) {
      if (*(long *)(piVar5 + 6) == 0) {
        return -1;
      }
      if (*(long *)(piVar5 + 2) == 0) {
        return -1;
      }
      if (piVar5[1] != *(int *)(*(long *)(piVar5 + 6) + -4 + (long)*piVar5 * 4) + 1) {
        return -1;
      }
      uVar2 = params->flags;
      if ((uVar2 & 2) != 0) {
        if ((uVar2 & 1) == 0) {
          return -2;
        }
        pQVar1 = &worker->clip_box;
        if ((uVar2 & 4) == 0) {
          pQVar1->xMin = -0x800000;
          pQVar1->yMin = -0x800000;
          (worker->clip_box).xMax = 0x7fffff;
          (worker->clip_box).yMax = 0x7fffff;
        }
        else {
          QVar9 = (params->clip_box).yMin;
          QVar10 = (params->clip_box).xMax;
          QVar11 = (params->clip_box).yMax;
          pQVar1->xMin = (params->clip_box).xMin;
          pQVar1->yMin = QVar9;
          (worker->clip_box).xMax = QVar10;
          (worker->clip_box).yMax = QVar11;
          ppTVar19 = (PCell_conflict *)raster->buffer;
          lVar20 = raster->buffer_size;
        }
LAB_003902f0:
        worker->buffer = ppTVar19;
        worker->buffer_size = lVar20;
        worker->ycells = ppTVar19;
        worker->area = 0;
        worker->cover = 0;
        worker->invalid = 1;
        worker->cells = (PCell_conflict)0x0;
        worker->max_cells = 0;
        worker->num_cells = 0;
        iVar18 = piVar5[1];
        pQVar6 = *(QT_FT_Vector **)(piVar5 + 2);
        pcVar7 = *(char **)(piVar5 + 4);
        piVar8 = *(int **)(piVar5 + 6);
        (worker->outline).n_contours = piVar5[0];
        (worker->outline).n_points = iVar18;
        (worker->outline).points = pQVar6;
        (worker->outline).tags = pcVar7;
        (worker->outline).contours = piVar8;
        iVar18 = piVar5[9];
        (worker->outline).flags = piVar5[8];
        *(int *)&(worker->outline).field_0x24 = iVar18;
        worker->invalid = 1;
        worker->band_size = raster->band_size;
        if (pQVar4 != (QT_FT_Bitmap *)0x0) {
          (worker->target).palette = pQVar4->palette;
          iVar18 = pQVar4->rows;
          iVar3 = pQVar4->width;
          iVar16 = pQVar4->pitch;
          uVar17 = *(undefined4 *)&pQVar4->field_0xc;
          sVar12 = pQVar4->num_grays;
          cVar13 = pQVar4->pixel_mode;
          cVar14 = pQVar4->palette_mode;
          uVar15 = *(undefined4 *)&pQVar4->field_0x1c;
          (worker->target).buffer = pQVar4->buffer;
          (worker->target).num_grays = sVar12;
          (worker->target).pixel_mode = cVar13;
          (worker->target).palette_mode = cVar14;
          *(undefined4 *)&(worker->target).field_0x1c = uVar15;
          (worker->target).rows = iVar18;
          (worker->target).width = iVar3;
          (worker->target).pitch = iVar16;
          *(undefined4 *)&(worker->target).field_0xc = uVar17;
        }
        worker->render_span = gray_render_span;
        worker->render_span_data = worker;
        if ((params->flags & 2) != 0) {
          worker->render_span = params->gray_spans;
          worker->render_span_data = params->user;
        }
        iVar18 = gray_convert_glyph(worker);
        return iVar18;
      }
      if (pQVar4 == (QT_FT_Bitmap *)0x0) goto LAB_003902b0;
      iVar18 = pQVar4->width;
      if (iVar18 != 0) {
        iVar3 = pQVar4->rows;
        if (iVar3 == 0) {
          return 0;
        }
        if (pQVar4->buffer == (uchar *)0x0) {
          return -3;
        }
        if ((uVar2 & 1) == 0) {
          return -2;
        }
        (worker->clip_box).xMin = 0;
        (worker->clip_box).yMin = 0;
        (worker->clip_box).xMax = iVar18;
        (worker->clip_box).yMax = iVar3;
        goto LAB_003902f0;
      }
    }
    iVar18 = 0;
  }
  return iVar18;
}

Assistant:

static int
  gray_raster_render( QT_FT_Raster                  raster,
                      const QT_FT_Raster_Params*  params )
  {
    const QT_FT_Outline*  outline    = (const QT_FT_Outline*)params->source;
    const QT_FT_Bitmap*   target_map = params->target;
    PWorker            worker;


    if ( !raster || !raster->buffer || !raster->buffer_size )
      return ErrRaster_Invalid_Argument;

    /* Should always be non-null, it is set by raster_reset() which is always */
    /* called with a non-null pool, and a pool_size >= MINIMUM_POOL_SIZE.     */
    assert(raster->worker);

    raster->worker->skip_spans = params->skip_spans;

    /* If raster object and raster buffer are allocated, but  */
    /* raster size isn't of the minimum size, indicate out of */
    /* memory.                                                */
    if (raster->buffer_allocated_size < MINIMUM_POOL_SIZE )
      return ErrRaster_OutOfMemory;

    if ( !outline )
      return ErrRaster_Invalid_Outline;

    /* return immediately if the outline is empty */
    if ( outline->n_points == 0 || outline->n_contours <= 0 )
      return 0;

    if ( !outline->contours || !outline->points )
      return ErrRaster_Invalid_Outline;

    if ( outline->n_points !=
           outline->contours[outline->n_contours - 1] + 1 )
      return ErrRaster_Invalid_Outline;

    worker = raster->worker;

    /* if direct mode is not set, we must have a target bitmap */
    if ( ( params->flags & QT_FT_RASTER_FLAG_DIRECT ) == 0 )
    {
      if ( !target_map )
        return ErrRaster_Invalid_Argument;

      /* nothing to do */
      if ( !target_map->width || !target_map->rows )
        return 0;

      if ( !target_map->buffer )
        return ErrRaster_Invalid_Argument;
    }

    /* this version does not support monochrome rendering */
    if ( !( params->flags & QT_FT_RASTER_FLAG_AA ) )
      return ErrRaster_Invalid_Mode;

    /* compute clipping box */
    if ( ( params->flags & QT_FT_RASTER_FLAG_DIRECT ) == 0 )
    {
      /* compute clip box from target pixmap */
      ras.clip_box.xMin = 0;
      ras.clip_box.yMin = 0;
      ras.clip_box.xMax = target_map->width;
      ras.clip_box.yMax = target_map->rows;
    }
    else if ( params->flags & QT_FT_RASTER_FLAG_CLIP )
    {
      ras.clip_box = params->clip_box;
    }
    else
    {
      ras.clip_box.xMin = -(1 << 23);
      ras.clip_box.yMin = -(1 << 23);
      ras.clip_box.xMax =  (1 << 23) - 1;
      ras.clip_box.yMax =  (1 << 23) - 1;
    }

    gray_init_cells( worker, raster->buffer, raster->buffer_size );

    ras.outline   = *outline;
    ras.num_cells = 0;
    ras.invalid   = 1;
    ras.band_size = raster->band_size;

    if ( target_map )
      ras.target = *target_map;

    ras.render_span      = (QT_FT_Raster_Span_Func)gray_render_span;
    ras.render_span_data = &ras;

    if ( params->flags & QT_FT_RASTER_FLAG_DIRECT )
    {
      ras.render_span      = (QT_FT_Raster_Span_Func)params->gray_spans;
      ras.render_span_data = params->user;
    }

    return gray_convert_glyph( worker );
  }